

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::SpotLightSource::writeTo(SpotLightSource *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *__buf;
  BinaryWriter *in_RSI;
  vec3f *in_RDI;
  
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_RDI);
  BinaryWriter::write(in_RSI,(int)in_RDI + 0x40,__buf,in_RCX);
  BinaryWriter::write<float>(in_RSI,&in_RDI->x);
  BinaryWriter::write<float>(in_RSI,&in_RDI->x);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_RDI);
  return 0x47;
}

Assistant:

int SpotLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(to);
    binary.write(I);
    binary.write(Ispectrum);
    binary.write(coneAngle);
    binary.write(coneDeltaAngle);
    binary.write(scale);
    return TYPE_DISTANT_LIGHT_SOURCE;
  }